

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O0

void __thiscall kratos::FSMState::check_outputs(FSMState *this)

{
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  bool bVar1;
  unordered_map<kratos::Var_*,_kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
  *puVar2;
  VarException *pVVar3;
  remove_reference_t<std::__cxx11::basic_string<char>_> *in_RCX;
  char (*format_str) [18];
  remove_reference_t<const_std::__cxx11::basic_string<char>_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  allocator<const_kratos::IRNode_*> local_2e9;
  Var *local_2e8;
  Var **local_2e0;
  size_type local_2d8;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_2d0;
  char local_2b8 [32];
  string local_298;
  _Node_iterator_base<std::pair<kratos::Var_*const,_kratos::Var_*>,_false> local_278;
  _Node_iterator_base<std::pair<kratos::Var_*const,_kratos::Var_*>,_false> local_270;
  reference local_268;
  Var **output_1;
  pair<kratos::Var_*const,_kratos::Var_*> *iter;
  iterator __end1_1;
  iterator __begin1_1;
  map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
  *__range1_1;
  enable_shared_from_this<kratos::Var> local_230;
  undefined1 local_21a;
  allocator<const_kratos::IRNode_*> local_219;
  type local_218;
  type *local_210;
  size_type local_208;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_200;
  v7 local_1e8 [32];
  string local_1c8;
  _Self local_1a8 [3];
  _Self local_190;
  type *local_188;
  type *default_;
  type *output;
  _Node_iterator_base<std::pair<kratos::Var_*const,_kratos::Var_*>,_false> local_170;
  iterator __end1;
  iterator __begin1;
  unordered_map<kratos::Var_*,_kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
  *__range1;
  unordered_map<kratos::Var_*,_kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
  outputs;
  FSMState *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_110;
  basic_string_view<char> local_108;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_f8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_e8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_d8;
  string *local_d0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_c8;
  basic_string_view<char> local_b8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_80;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  char (*local_70) [32];
  char *local_68;
  string *local_60;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  outputs._M_h._M_single_bucket = (__node_base_ptr)this;
  puVar2 = FSM::outputs(this->parent_);
  std::
  unordered_map<kratos::Var_*,_kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
  ::unordered_map((unordered_map<kratos::Var_*,_kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
                   *)&__range1,puVar2);
  __end1 = std::
           unordered_map<kratos::Var_*,_kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
           ::begin((unordered_map<kratos::Var_*,_kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
                    *)&__range1);
  local_170._M_cur =
       (__node_type *)
       std::
       unordered_map<kratos::Var_*,_kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
       ::end((unordered_map<kratos::Var_*,_kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
              *)&__range1);
  do {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<kratos::Var_*const,_kratos::Var_*>,_false>
                       ,&local_170);
    if (!bVar1) {
      __end1_1 = std::
                 map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
                 ::begin(&this->output_values_);
      iter = (pair<kratos::Var_*const,_kratos::Var_*> *)
             std::
             map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
             ::end(&this->output_values_);
      while( true ) {
        bVar1 = std::operator!=(&__end1_1,(_Self *)&iter);
        if (!bVar1) {
          std::
          unordered_map<kratos::Var_*,_kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
          ::~unordered_map((unordered_map<kratos::Var_*,_kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
                            *)&__range1);
          return;
        }
        local_268 = std::_Rb_tree_iterator<std::pair<kratos::Var_*const,_kratos::Var_*>_>::operator*
                              (&__end1_1);
        output_1 = &local_268->first;
        local_270._M_cur =
             (__node_type *)
             std::
             unordered_map<kratos::Var_*,_kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
             ::find((unordered_map<kratos::Var_*,_kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
                     *)&__range1,&local_268->first);
        local_278._M_cur =
             (__node_type *)
             std::
             unordered_map<kratos::Var_*,_kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
             ::end((unordered_map<kratos::Var_*,_kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
                    *)&__range1);
        bVar1 = std::__detail::operator==(&local_270,&local_278);
        if (bVar1) break;
        std::_Rb_tree_iterator<std::pair<kratos::Var_*const,_kratos::Var_*>_>::operator++(&__end1_1)
        ;
      }
      pVVar3 = (VarException *)__cxa_allocate_exception(0x10);
      (*(local_268->first->super_IRNode)._vptr_IRNode[0x1f])(local_2b8);
      vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)FSM::fsm_name_abi_cxx11_(this->parent_);
      local_60 = &local_298;
      local_68 = "{0} is not specified in FSM {1}";
      local_70 = &local_2b8;
      fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string_const&,char[32],char>
                (&local_a8,(v7 *)"{0} is not specified in FSM {1}",local_70,
                 (remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs_1,in_R8);
      local_80 = &local_a8;
      local_b8 = fmt::v7::to_string_view<char,_0>(local_68);
      local_28 = &local_c8;
      local_30 = local_80;
      local_20 = local_80;
      local_10 = local_80;
      local_18 = local_28;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_28,0xdd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_80);
      format_str_01.size_ = local_c8.desc_;
      format_str_01.data_ = (char *)local_b8.size_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_c8.field_1.values_;
      fmt::v7::detail::vformat_abi_cxx11_(&local_298,(detail *)local_b8.data_,format_str_01,args_00)
      ;
      local_2e8 = local_268->first;
      local_2e0 = &local_2e8;
      local_2d8 = 1;
      std::allocator<const_kratos::IRNode_*>::allocator(&local_2e9);
      __l._M_len = local_2d8;
      __l._M_array = (iterator)local_2e0;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_2d0,__l,&local_2e9);
      VarException::VarException(pVVar3,&local_298,&local_2d0);
      __cxa_throw(pVVar3,&VarException::typeinfo,VarException::~VarException);
    }
    output = &std::__detail::
              _Node_iterator<std::pair<kratos::Var_*const,_kratos::Var_*>,_false,_false>::operator*
                        (&__end1)->first;
    default_ = std::get<0ul,kratos::Var*const,kratos::Var*>
                         ((pair<kratos::Var_*const,_kratos::Var_*> *)output);
    local_188 = std::get<1ul,kratos::Var*const,kratos::Var*>
                          ((pair<kratos::Var_*const,_kratos::Var_*> *)output);
    local_190._M_node =
         (_Base_ptr)
         std::
         map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
         ::find(&this->output_values_,default_);
    local_1a8[0]._M_node =
         (_Base_ptr)
         std::
         map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
         ::end(&this->output_values_);
    bVar1 = std::operator==(&local_190,local_1a8);
    if (bVar1) {
      if (*local_188 == (type)0x0) {
        local_21a = 1;
        pVVar3 = (VarException *)__cxa_allocate_exception(0x10);
        (*((*default_)->super_IRNode)._vptr_IRNode[0x1f])(local_1e8);
        local_d0 = &local_1c8;
        local_d8 = "{0} not specified";
        vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_1e8;
        local_f8.named_args.data =
             (named_arg_info<char> *)
             fmt::v7::make_args_checked<std::__cxx11::string,char[18],char>
                       ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)"{0} not specified",(v7 *)vargs,format_str,in_RCX);
        local_e8 = &local_f8;
        local_108 = fmt::v7::to_string_view<char,_0>(local_d8);
        local_50 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)&this_local;
        local_58 = local_e8;
        local_48 = local_e8;
        local_38 = local_e8;
        local_40 = local_50;
        fmt::v7::
        basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::basic_format_args(local_50,0xd,
                            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)&local_e8->string);
        format_str_00.size_ = (size_t)this_local;
        format_str_00.data_ = (char *)local_108.size_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_110.values_;
        fmt::v7::detail::vformat_abi_cxx11_(&local_1c8,(detail *)local_108.data_,format_str_00,args)
        ;
        local_218 = *default_;
        local_210 = &local_218;
        local_208 = 1;
        std::allocator<const_kratos::IRNode_*>::allocator(&local_219);
        __l_00._M_len = local_208;
        __l_00._M_array = (iterator)local_210;
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  (&local_200,__l_00,&local_219);
        VarException::VarException(pVVar3,&local_1c8,&local_200);
        local_21a = 0;
        __cxa_throw(pVVar3,&VarException::typeinfo,VarException::~VarException);
      }
      std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_230);
      std::enable_shared_from_this<kratos::Var>::shared_from_this
                ((enable_shared_from_this<kratos::Var> *)&__range1_1);
      FSMState::output(this,(shared_ptr<kratos::Var> *)&local_230,
                       (shared_ptr<kratos::Var> *)&__range1_1);
      std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&__range1_1);
      std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_230);
    }
    std::__detail::_Node_iterator<std::pair<kratos::Var_*const,_kratos::Var_*>,_false,_false>::
    operator++(&__end1);
  } while( true );
}

Assistant:

void FSMState::check_outputs() {
    auto outputs = parent_->outputs();
    for (auto const& [output, default_] : outputs) {
        if (output_values_.find(output) == output_values_.end()) {
            if (!default_) {
                throw VarException(::format("{0} not specified", output->to_string()), {output});
            } else {
                // insert it to the output values
                this->output(output->shared_from_this(), default_->shared_from_this());
            }
        }
    }
    // the other way, this is to ensure a bijection
    for (auto const& iter : output_values_) {
        auto const& output = iter.first;
        if (outputs.find(output) == outputs.end()) {
            throw VarException(::format("{0} is not specified in FSM {1}", output->to_string(),
                                        parent_->fsm_name()),
                               {output});
        }
    }
}